

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

uint64_t fdb_kvs_header_append(fdb_kvs_handle *handle)

{
  uint64_t uVar1;
  docio_length len_00;
  fdb_status fVar2;
  size_t sVar3;
  bid_t bVar4;
  docio_handle *in_RDI;
  docio_handle *dhandle;
  filemgr *file;
  docio_length doc_len;
  docio_object doc;
  uint64_t prev_offset;
  uint64_t kv_info_offset;
  size_t len;
  void *data;
  char *doc_key;
  docio_object *in_stack_ffffffffffffff38;
  docio_handle *in_stack_ffffffffffffff40;
  undefined1 local_b8 [64];
  undefined1 local_78 [16];
  filemgr_header_len_t local_68 [4];
  size_t in_stack_ffffffffffffffa0;
  __atomic_base<unsigned_long> in_stack_ffffffffffffffa8;
  __atomic_base<unsigned_long> in_stack_ffffffffffffffb0;
  __atomic_base<unsigned_long> file_00;
  __atomic_base<unsigned_long> in_stack_ffffffffffffffb8;
  __atomic_base<unsigned_long> in_stack_ffffffffffffffc0;
  __atomic_base<unsigned_long> in_stack_ffffffffffffffe8;
  __atomic_base<unsigned_long> length;
  
  file_00._M_i = (__int_type)local_b8;
  docio_object::docio_object((docio_object *)in_stack_ffffffffffffff40);
  docio_length::docio_length((docio_length *)local_78);
  local_b8._56_8_ = in_RDI[1].curblock;
  local_b8._48_4_ = in_RDI[1].curpos;
  local_b8._52_2_ = in_RDI[1].cur_bmp_revnum_hash;
  local_b8._54_2_ = *(undefined2 *)&in_RDI[1].field_0x16;
  _fdb_kvs_header_export
            ((kvs_header *)in_stack_ffffffffffffffc0._M_i,(void **)in_stack_ffffffffffffffb8._M_i,
             (size_t *)in_stack_ffffffffffffffb0._M_i,in_stack_ffffffffffffffa8._M_i);
  uVar1 = in_RDI[6].lastBmpRevnum;
  memset(local_68,0,0x38);
  sprintf((char *)file_00._M_i,"KV_header");
  length._M_i = file_00._M_i;
  sVar3 = strlen((char *)file_00._M_i);
  local_68[0] = (short)sVar3 + 1;
  local_68[1] = 0;
  bVar4 = docio_append_doc_system(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  free((void *)in_stack_ffffffffffffffe8._M_i);
  if ((uVar1 != 0xffffffffffffffff) &&
     (fVar2 = docio_read_doc_length
                        (in_RDI,(docio_length *)length._M_i,in_stack_ffffffffffffffe8._M_i),
     fVar2 == FDB_RESULT_SUCCESS)) {
    local_b8._32_8_ = local_78._0_8_;
    local_b8._40_8_ = local_78._8_8_;
    len_00.bodylen_ondisk = local_78._8_4_;
    len_00.flag = local_78[0xc];
    len_00.checksum = local_78[0xd];
    len_00.reserved = local_78._14_2_;
    len_00.keylen = local_78._0_2_;
    len_00.metalen = local_78._2_2_;
    len_00.bodylen = local_78._4_4_;
    _fdb_get_docsize(len_00);
    filemgr_mark_stale((filemgr *)file_00._M_i,in_stack_ffffffffffffffa8._M_i,
                       in_stack_ffffffffffffffa0);
  }
  return bVar4;
}

Assistant:

uint64_t fdb_kvs_header_append(fdb_kvs_handle *handle)
{
    char *doc_key = alca(char, 32);
    void *data;
    size_t len;
    uint64_t kv_info_offset, prev_offset;
    struct docio_object doc;
    struct docio_length doc_len;
    struct filemgr *file = handle->file;
    struct docio_handle *dhandle = handle->dhandle;

    _fdb_kvs_header_export(file->kv_header, &data, &len, file->version);

    prev_offset = handle->kv_info_offset;

    memset(&doc, 0, sizeof(struct docio_object));
    sprintf(doc_key, "KV_header");
    doc.key = (void *)doc_key;
    doc.meta = NULL;
    doc.body = data;
    doc.length.keylen = strlen(doc_key) + 1;
    doc.length.metalen = 0;
    doc.length.bodylen = len;
    doc.seqnum = 0;
    kv_info_offset = docio_append_doc_system(dhandle, &doc);
    free(data);

    if (prev_offset != BLK_NOT_FOUND) {
        if (docio_read_doc_length(handle->dhandle, &doc_len, prev_offset)
            == FDB_RESULT_SUCCESS) {
            // mark stale
            filemgr_mark_stale(handle->file, prev_offset, _fdb_get_docsize(doc_len));
        }
    }

    return kv_info_offset;
}